

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O2

void __thiscall
TEST_MockNamedValueHandlerRepository_installCopier_Test::testBody
          (TEST_MockNamedValueHandlerRepository_installCopier_Test *this)

{
  UtestShell *pUVar1;
  MockNamedValueCopier *pMVar2;
  TestTerminator *pTVar3;
  SimpleString local_38;
  TypeForTestingExpectedFunctionCallCopier copier;
  MockNamedValueComparatorsAndCopiersRepository repository;
  
  copier.super_MockNamedValueCopier._vptr_MockNamedValueCopier =
       (MockNamedValueCopier)&PTR__MockNamedValueCopier_002c06a8;
  MockNamedValueComparatorsAndCopiersRepository::MockNamedValueComparatorsAndCopiersRepository
            (&repository);
  SimpleString::SimpleString(&local_38,"typeName");
  MockNamedValueComparatorsAndCopiersRepository::installCopier
            (&repository,&local_38,&copier.super_MockNamedValueCopier);
  SimpleString::~SimpleString(&local_38);
  pUVar1 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_38,"typeName");
  pMVar2 = MockNamedValueComparatorsAndCopiersRepository::getCopierForType(&repository,&local_38);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[0x13])
            (pUVar1,&copier,pMVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x78,pTVar3);
  SimpleString::~SimpleString(&local_38);
  MockNamedValueComparatorsAndCopiersRepository::~MockNamedValueComparatorsAndCopiersRepository
            (&repository);
  return;
}

Assistant:

virtual void copy(void* dst_, const void* src_) _override
    {
        TypeForTestingExpectedFunctionCall* dst = (TypeForTestingExpectedFunctionCall*) dst_;
        const TypeForTestingExpectedFunctionCall* src = (const TypeForTestingExpectedFunctionCall*) src_;
        *(dst->value) = *(src->value);
    }